

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  _Bit_pointer puVar5;
  PyTypeObject **ppPVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  type_info *find_type;
  long lVar11;
  PyObject *pPVar12;
  internals *piVar13;
  handle hVar14;
  undefined8 *puVar15;
  long *plVar16;
  function_call *pfVar17;
  function_call *pfVar18;
  object *poVar19;
  ushort uVar20;
  ulong uVar21;
  ulong uVar22;
  instance *piVar23;
  uint uVar24;
  uint __uval;
  PyTypeObject *pPVar25;
  PyTypeObject *type;
  size_type __new_size;
  char cVar26;
  uint __len;
  ulong uVar27;
  ulong uVar28;
  function_call *pfVar29;
  ulong uVar30;
  PyObject *tmp;
  Py_ssize_t *pPVar31;
  bool bVar32;
  handle arg;
  tuple extra_args;
  loader_life_support guard_1;
  dict kwargs_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  undefined1 local_1d8 [24];
  object oStack_1c0;
  _Bit_pointer local_1b8;
  function_call *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  _Bit_pointer local_188;
  function_call *local_178;
  instance *local_170;
  undefined1 local_168 [8];
  undefined1 auStack_160 [16];
  handle *phStack_150;
  anon_union_24_2_63b86169_for_instance_1 local_148;
  handle hStack_130;
  _Bit_pointer local_128;
  object oStack_120;
  object local_118;
  handle local_110;
  handle local_108;
  handle local_100;
  undefined1 local_f8 [32];
  ushort *local_d8;
  handle local_d0;
  long local_c8;
  PyObject local_c0;
  ulong local_b0;
  ulong local_a8;
  void *local_98;
  PyTypeObject *local_90;
  value_and_holder local_88;
  PyObject *local_68;
  ulong local_60;
  object local_58;
  PyTypeObject **local_50;
  handle local_48;
  object local_40;
  object local_38;
  
  local_170 = (instance *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/pybind11.h"
                  ,0x227,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_a8 = args_in[1].ob_refcnt;
  if (local_a8 == 0) {
    local_88.type = (type_info *)0x0;
    local_88.vh = (void **)0x0;
    local_88.inst = (instance *)0x0;
    local_88.index = 0;
    if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 1) != 0) goto LAB_0010de41;
    local_d8 = (ushort *)((long)&local_170[1].field_1 + 0x11);
    pPVar25 = (PyTypeObject *)0x0;
  }
  else {
    pPVar25 = args_in[1].ob_type;
    local_d8 = (ushort *)((long)&local_170[1].field_1 + 0x11);
    local_88.type = (type_info *)0x0;
    local_88.vh = (void **)0x0;
    local_88.inst = (instance *)0x0;
    local_88.index = 0;
    if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 1) != 0) {
      if (pPVar25 == (PyTypeObject *)0x0) {
LAB_0010de41:
        PyErr_SetString(_PyExc_TypeError,
                        "__init__(self, ...) called with invalid or missing `self` argument");
        return (PyObject *)0x0;
      }
      type = (PyTypeObject *)local_170[2].ob_base.ob_refcnt;
      if ((pPVar25->ob_base).ob_base.ob_type != type) {
        iVar9 = PyType_IsSubtype();
        if (iVar9 == 0) goto LAB_0010de41;
        type = (PyTypeObject *)local_170[2].ob_base.ob_refcnt;
      }
      find_type = detail::get_type_info(type);
      detail::instance::get_value_and_holder
                ((value_and_holder *)local_168,(instance *)pPVar25,find_type,true);
      local_88.type = (type_info *)auStack_160._8_8_;
      local_88.vh = &phStack_150->m_ptr;
      local_88.inst = (instance *)local_168;
      local_88.index = auStack_160._0_8_;
      bVar8 = (byte)((PyObject *)((long)local_168 + 0x30))->ob_refcnt;
      if ((bVar8 & 2) == 0) {
        bVar8 = *(byte *)((long)&(((PyObject *)((long)local_168 + 0x10))->ob_type->ob_base).ob_base.
                                 ob_refcnt + (long)(PyObject **)auStack_160._0_8_) & 2;
      }
      else {
        bVar8 = bVar8 >> 3 & 1;
      }
      if (bVar8 != 0) {
        __Py_NoneStruct = __Py_NoneStruct + 1;
        local_168 = (undefined1  [8])0x0;
        object::~object((object *)local_168);
        return (PyObject *)&_Py_NoneStruct;
      }
    }
  }
  local_f8._0_8_ = (PyObject *)0x0;
  local_f8._8_8_ = (function_call *)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_98 = local_170[2].field_1.simple_value_holder[0];
  local_50 = &args_in[1].ob_type;
  local_68 = (PyObject *)0x1;
  hVar14.m_ptr = &local_170->ob_base;
  local_1b0 = (function_call *)kwargs_in;
  local_178 = (function_call *)args_in;
  local_90 = pPVar25;
  do {
    uVar20 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
    uVar24 = (uVar20 & 0x20) >> 5;
    local_60 = (long)(short)((uint)(int)(short)(uVar20 << 9) >> 0xf) +
               ((ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4) - (ulong)uVar24);
    uVar21 = local_60 - *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 6);
    if (((uVar24 != 0) || (local_a8 <= uVar21)) &&
       ((local_b0 = uVar21, uVar21 <= local_a8 ||
        (uVar21 <= (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)hVar14.m_ptr[1].ob_type >> 5))))) {
      local_148.simple_value_holder[2] = (function_call *)0x0;
      hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
      local_148.simple_value_holder[1] =
           (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
      phStack_150 = (handle *)0x0;
      local_148.simple_value_holder[0] = (function_call *)0x0;
      auStack_160._0_8_ = (pointer)0x0;
      auStack_160._8_8_ = (type_info *)0x0;
      local_118.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_128 = (_Bit_pointer)0x0;
      oStack_120.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_110.m_ptr = (PyObject *)local_90;
      local_108.m_ptr = (PyObject *)0x0;
      local_168 = (undefined1  [8])hVar14.m_ptr;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_160,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      uVar21 = local_b0;
      if (local_a8 < local_b0) {
        uVar21 = local_a8;
      }
      if (((ulong)hVar14.m_ptr[5].ob_type & 0x200) == 0) {
        uVar28 = 0;
      }
      else {
        if (*(PyObject **)local_88.vh != (PyObject *)0x0) {
          (*(local_88.type)->dealloc)(&local_88);
        }
        if ((((PyTypeObject *)
             (((function_call *)args_in)->args).
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/pybind11.h"
                        ,0x274,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_108.m_ptr =
             *(PyObject **)
              ((long)&(((function_call *)args_in)->args).
                      super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                      _M_impl.super__Vector_impl_data + 0x10);
        local_1d8._0_8_ = &local_88;
        if ((handle *)auStack_160._8_8_ == phStack_150) {
          std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
          _M_realloc_insert<_object*>
                    ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                     (iterator)auStack_160._8_8_,(_object **)local_1d8);
        }
        else {
          *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
          auStack_160._8_8_ = auStack_160._8_8_ + 8;
        }
        uVar28 = 1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
      }
      uVar30 = uVar28;
      if (uVar28 < uVar21) {
        uVar27 = (ulong)(uint)((int)uVar28 << 5);
        do {
          pPVar25 = hVar14.m_ptr[1].ob_type;
          if (uVar28 < (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)pPVar25 >> 5)) {
            plVar16 = (long *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar27);
            bVar32 = pPVar25 != (PyTypeObject *)0x0;
            if ((((local_1b0 != (function_call *)0x0) && (pPVar25 != (PyTypeObject *)0x0)) &&
                (bVar32 = true, *plVar16 != 0)) &&
               (lVar11 = PyDict_GetItemString(local_1b0), lVar11 != 0)) {
LAB_0010e4b7:
              bVar32 = false;
              kwargs_in = (PyObject *)local_1b0;
              goto LAB_0010e824;
            }
            if ((((PyTypeObject *)
                 (local_178->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0010f5eb;
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&(local_178->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data + uVar28 * 8 + 0x10);
            args_in = (PyObject *)local_178;
            if (bVar32) {
              bVar32 = true;
              if (((*(byte *)((long)&pPVar25->tp_name + uVar27) & 2) == 0) &&
                 (bVar32 = true,
                 (function_call *)local_1d8._0_8_ == (function_call *)&_Py_NoneStruct))
              goto LAB_0010e4b7;
            }
            else {
              bVar32 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (((function_call *)args_in)->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0010f5eb:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/pybind11.h"
                            ,0x283,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&(((function_call *)args_in)->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data + uVar28 * 8 + 0x10);
            bVar32 = false;
            plVar16 = (long *)0x0;
          }
          if ((handle *)auStack_160._8_8_ == phStack_150) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,(handle *)local_1d8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          bVar8 = 1;
          if (bVar32) {
            bVar8 = *(byte *)(plVar16 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,(bool)(bVar8 & 1));
          uVar28 = uVar28 + 1;
          uVar27 = uVar27 + 0x20;
          kwargs_in = (PyObject *)local_1b0;
          uVar30 = uVar21;
        } while (uVar21 != uVar28);
      }
      if ((function_call *)kwargs_in != (function_call *)0x0) {
        ((PyObject *)&((function_call *)kwargs_in)->func)->ob_refcnt =
             ((PyObject *)&((function_call *)kwargs_in)->func)->ob_refcnt + 1;
      }
      uVar28 = (ulong)*(ushort *)&hVar14.m_ptr[6].ob_refcnt;
      local_d0.m_ptr = kwargs_in;
      if (uVar30 < uVar28) {
        lVar11 = uVar30 * 0x20;
        local_1d8._0_8_ = *(undefined8 *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar11 + 0x10)
        ;
        if ((function_call *)local_1d8._0_8_ != (function_call *)0x0) {
          pPVar31 = (Py_ssize_t *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar11);
          lVar11 = lVar11 + 0x30;
          uVar27 = uVar30;
          do {
            if ((handle *)auStack_160._8_8_ == phStack_150) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                         (iterator)auStack_160._8_8_,(handle *)local_1d8);
            }
            else {
              *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
              auStack_160._8_8_ = auStack_160._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                       (bool)((byte)pPVar31[3] & 1));
            uVar30 = uVar27 + 1;
            uVar20 = *(ushort *)&hVar14.m_ptr[6].ob_refcnt;
            uVar28 = (ulong)uVar20;
            uVar22 = (ulong)uVar20;
            if (uVar20 <= uVar30) goto LAB_0010e28b;
            pPVar31 = &(hVar14.m_ptr[1].ob_type)->tp_basicsize + uVar27 * 4;
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&((hVar14.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar11);
            lVar11 = lVar11 + 0x20;
            uVar27 = uVar30;
          } while ((function_call *)local_1d8._0_8_ != (function_call *)0x0);
        }
        local_1d8._0_8_ = (function_call *)0x0;
        uVar22 = uVar28;
LAB_0010e28b:
        if (uVar22 <= uVar30) goto LAB_0010e294;
LAB_0010e3ec:
        bVar32 = false;
      }
      else {
LAB_0010e294:
        if (uVar30 < local_60) {
          uVar28 = uVar30 << 5 | 0x18;
          bVar32 = false;
          do {
            pPVar25 = hVar14.m_ptr[1].ob_type;
            local_1d8._0_8_ = (function_call *)0x0;
            if (((local_1b0 == (function_call *)0x0) ||
                (*(long *)((long)pPVar25 + (uVar28 - 0x18)) == 0)) ||
               (local_1d8._0_8_ = PyDict_GetItemString(local_d0.m_ptr),
               (function_call *)local_1d8._0_8_ == (function_call *)0x0)) {
              pfVar29 = *(function_call **)((long)pPVar25 + (uVar28 - 8));
              if (pfVar29 != (function_call *)0x0) {
                local_1d8._0_8_ = pfVar29;
              }
            }
            else {
              if (!bVar32) {
                local_1a8._0_8_ = PyDict_Copy(local_d0.m_ptr);
                object::operator=((object *)&local_d0,(object *)local_1a8);
                object::~object((object *)local_1a8);
              }
              bVar32 = true;
              PyDict_DelItemString(local_d0.m_ptr,*(undefined8 *)((long)pPVar25 + (uVar28 - 0x18)));
            }
            if (((*(byte *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar28) & 2) == 0 &&
                 (function_call *)local_1d8._0_8_ == (function_call *)&_Py_NoneStruct) ||
               ((function_call *)local_1d8._0_8_ == (function_call *)0x0)) {
              bVar32 = false;
              kwargs_in = (PyObject *)local_1b0;
              goto LAB_0010e817;
            }
            if ((handle *)auStack_160._8_8_ == phStack_150) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                         (iterator)auStack_160._8_8_,(handle *)local_1d8);
            }
            else {
              *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
              auStack_160._8_8_ = auStack_160._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                       (bool)(*(byte *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar28) & 1));
            uVar30 = uVar30 + 1;
            uVar28 = uVar28 + 0x20;
          } while (uVar30 < local_60);
        }
        if ((function_call *)local_d0.m_ptr == (function_call *)0x0) {
          uVar20 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        else {
          lVar11 = PyDict_Size();
          uVar20 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
          if ((lVar11 != 0) && (kwargs_in = (PyObject *)local_1b0, (uVar20 & 0x40) == 0))
          goto LAB_0010e3ec;
        }
        kwargs_in = (PyObject *)local_1b0;
        if ((uVar20 & 0x20) != 0) {
          tuple::tuple((tuple *)local_1a8,0);
          if (uVar21 == 0) {
            ((PyObject *)&((function_call *)args_in)->func)->ob_refcnt =
                 ((PyObject *)&((function_call *)args_in)->func)->ob_refcnt + 1;
            local_1d8._0_8_ = args_in;
LAB_0010e4d8:
            object::operator=((object *)local_1a8,(object *)local_1d8);
            object::~object((object *)local_1d8);
          }
          else {
            pfVar29 = (function_call *)(local_a8 - uVar30);
            if (local_a8 < uVar30 || pfVar29 == (function_call *)0x0) {
              tuple::tuple((tuple *)local_1d8,0);
              goto LAB_0010e4d8;
            }
            tuple::tuple((tuple *)local_1d8,(size_t)pfVar29);
            object::operator=((object *)local_1a8,(object *)local_1d8);
            object::~object((object *)local_1d8);
            ppPVar6 = local_50;
            pfVar17 = (function_call *)0x0;
            do {
              if ((((PyTypeObject *)
                   (((function_call *)args_in)->args).
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/pybind11.h"
                              ,0x2dc,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1d8._8_8_ = local_1a8._0_8_;
              oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1d8._16_8_ = pfVar17;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_1a8._0_8_,(size_t)pfVar17,
                         (PyObject *)
                         ppPVar6[(long)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + uVar30)]);
              object::~object((object *)(local_1d8 + 0x18));
              pfVar17 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 1);
            } while (pfVar29 != pfVar17);
          }
          if ((handle *)auStack_160._8_8_ == phStack_150) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,(handle *)local_1a8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1a8._0_8_;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          kwargs_in = (PyObject *)local_1b0;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
          object::operator=(&oStack_120,(object *)local_1a8);
          object::~object((object *)local_1a8);
          uVar20 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        if ((uVar20 & 0x40) != 0) {
          if ((function_call *)local_d0.m_ptr == (function_call *)0x0) {
            dict::dict((dict *)local_1d8);
            object::operator=((object *)&local_d0,(object *)local_1d8);
            object::~object((object *)local_1d8);
          }
          if ((handle *)auStack_160._8_8_ == phStack_150) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,&local_d0);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = local_d0.m_ptr;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
          object::operator=(&local_118,(object *)&local_d0);
        }
        __new_size = (long)(auStack_160._8_8_ - auStack_160._0_8_) >> 3;
        if ((__new_size != *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4)) ||
           (((ulong)hStack_130.m_ptr & 0xffffffff) +
            ((long)local_148.simple_value_holder[2] - local_148._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_1a8._0_8_ = (PyObject *)0x0;
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_198._0_8_ = (function_call *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188 = (_Bit_pointer)0x0;
        if (local_98 != (void *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_1a8,__new_size,false);
          puVar5 = local_128;
          hVar4.m_ptr = hStack_130.m_ptr;
          uVar3 = local_148.simple_value_holder[2];
          uVar2 = local_148.simple_value_holder[1];
          uVar1 = local_148.simple_value_holder[0];
          local_1b8 = local_128;
          local_1d8._16_8_ = local_148.simple_value_holder[2];
          oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
          local_1d8._0_8_ = local_148.simple_value_holder[0];
          local_1d8._8_8_ = local_148.simple_value_holder[1];
          local_128 = local_188;
          local_148.simple_value_holder[2] = (void *)local_198._0_8_;
          hStack_130.m_ptr = (PyObject *)local_198._8_8_;
          local_148.simple_value_holder[0] = (void *)local_1a8._0_8_;
          local_148.simple_value_holder[1] = (void *)local_1a8._8_8_;
          local_188 = puVar5;
          local_198._0_8_ = uVar3;
          local_198._8_8_ = hVar4.m_ptr;
          local_1a8._0_8_ = uVar1;
          local_1a8._8_8_ = uVar2;
        }
        piVar13 = detail::get_internals();
        local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
        std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                  ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                   (_object **)&local_40);
        pPVar12 = (PyObject *)(*(code *)hVar14.m_ptr[3].ob_refcnt)(local_168);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1d8);
        puVar5 = local_128;
        hVar4.m_ptr = hStack_130.m_ptr;
        uVar3 = local_148.simple_value_holder[2];
        uVar2 = local_148.simple_value_holder[1];
        uVar1 = local_148.simple_value_holder[0];
        bVar32 = pPVar12 != (PyObject *)0x1;
        local_68 = pPVar12;
        if (local_98 != (void *)0x0 && !bVar32) {
          for (uVar21 = (ulong)(*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1) >> 4 & 1);
              uVar21 < local_b0; uVar21 = uVar21 + 1) {
            uVar28 = uVar21 + 0x3f;
            if (-1 < (long)uVar21) {
              uVar28 = uVar21;
            }
            if ((*(ulong *)(local_1a8._0_8_ +
                           (ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar28 >> 6) * 8 + -8) >> (uVar21 & 0x3f) & 1) != 0) {
              local_1b8 = local_128;
              local_1d8._16_8_ = local_148.simple_value_holder[2];
              oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
              local_1d8._0_8_ = local_148.simple_value_holder[0];
              local_1d8._8_8_ = local_148.simple_value_holder[1];
              local_128 = local_188;
              local_148.simple_value_holder[2] = (void *)local_198._0_8_;
              hStack_130.m_ptr = (PyObject *)local_198._8_8_;
              local_148.simple_value_holder[0] = (void *)local_1a8._0_8_;
              local_148.simple_value_holder[1] = (void *)local_1a8._8_8_;
              local_188 = puVar5;
              local_198._0_8_ = uVar3;
              local_198._8_8_ = hVar4.m_ptr;
              local_1a8._0_8_ = uVar1;
              local_1a8._8_8_ = uVar2;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_f8,(function_call *)local_168);
              break;
            }
          }
          bVar32 = false;
        }
        if ((function_call *)local_1a8._0_8_ != (function_call *)0x0) {
          operator_delete((void *)local_1a8._0_8_,(long)local_188 - local_1a8._0_8_);
        }
      }
LAB_0010e817:
      object::~object((object *)&local_d0);
LAB_0010e824:
      object::~object(&local_118);
      object::~object(&oStack_120);
      if ((function_call *)local_148.simple_value_holder[0] != (function_call *)0x0) {
        operator_delete(local_148.simple_value_holder[0],(long)local_128 - local_148._0_8_);
        local_148.simple_value_holder[0] = (function_call *)0x0;
        local_148.simple_value_holder[1] =
             (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
        local_148.simple_value_holder[2] = (function_call *)0x0;
        hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
        local_128 = (_Bit_pointer)0x0;
      }
      if ((pointer)auStack_160._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_160._0_8_,(long)phStack_150 - auStack_160._0_8_);
      }
      args_in = (PyObject *)local_178;
      if (bVar32) break;
    }
    hVar14.m_ptr = (PyObject *)hVar14.m_ptr[8].ob_refcnt;
  } while ((instance *)hVar14.m_ptr != (instance *)0x0);
  hVar14.m_ptr = local_68;
  uVar1 = local_f8._8_8_;
  if ((local_98 == (void *)0x0) || (local_f8._0_8_ == local_f8._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_f8);
    if (hVar14.m_ptr == (PyObject *)0x1) goto LAB_0010eafd;
  }
  else {
    if (local_68 == (PyObject *)0x1) {
      pfVar29 = (function_call *)local_f8._0_8_;
      do {
        piVar13 = detail::get_internals();
        local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
        std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                  ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                   (_object **)&local_38);
        hVar14 = (*pfVar29->func->impl)(pfVar29);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_168);
        if (hVar14.m_ptr != (PyObject *)0x1) goto LAB_0010e92f;
        pfVar29 = pfVar29 + 1;
      } while (pfVar29 != (function_call *)uVar1);
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_f8);
LAB_0010eafd:
      if ((*local_d8 & 8) != 0) {
        __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
        return (PyObject *)&_Py_NotImplementedStruct;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,(char *)(local_170->ob_base).ob_refcnt,
                 (allocator<char> *)&local_100);
      puVar15 = (undefined8 *)std::__cxx11::string::append(local_f8);
      pfVar29 = (function_call *)(puVar15 + 2);
      if ((function_call *)*puVar15 == pfVar29) {
        local_198._0_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
        local_198._8_8_ = puVar15[3];
        local_1a8._0_8_ = (PyObject *)local_198;
      }
      else {
        local_198._0_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
        local_1a8._0_8_ = (PyObject *)*puVar15;
      }
      local_1a8._8_8_ = puVar15[1];
      *puVar15 = pfVar29;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      iVar9 = 0x118c56;
      if ((*local_d8 & 1) != 0) {
        iVar9 = 0x118c4a;
      }
      local_d0.m_ptr = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,iVar9,iVar9 + (*local_d8 & 1) * 3 + 8);
      pfVar29 = (function_call *)((long)&((PyObject *)local_1a8._8_8_)->ob_refcnt + local_c8);
      pfVar17 = (function_call *)0xf;
      if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
        pfVar17 = (function_call *)local_198._0_8_;
      }
      if (pfVar17 < pfVar29) {
        pfVar17 = (function_call *)0xf;
        if (local_d0.m_ptr != &local_c0) {
          pfVar17 = (function_call *)local_c0.ob_refcnt;
        }
        if (pfVar17 < pfVar29) goto LAB_0010ec20;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_1a8._0_8_);
      }
      else {
LAB_0010ec20:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_1a8,(ulong)local_d0.m_ptr);
      }
      local_1d8._0_8_ = local_1d8 + 0x10;
      pfVar29 = (function_call *)(puVar15 + 2);
      if ((function_call *)*puVar15 == pfVar29) {
        local_1d8._16_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
        oStack_1c0.super_handle.m_ptr = (handle)puVar15[3];
      }
      else {
        local_1d8._16_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
        local_1d8._0_8_ = (function_call *)*puVar15;
      }
      local_1d8._8_8_ = puVar15[1];
      *puVar15 = pfVar29;
      puVar15[1] = 0;
      *(undefined1 *)&((PyObject *)&pfVar29->func)->ob_refcnt = 0;
      plVar16 = (long *)std::__cxx11::string::append(local_1d8);
      local_168 = (undefined1  [8])(auStack_160 + 8);
      piVar23 = (instance *)(plVar16 + 2);
      if ((instance *)*plVar16 == piVar23) {
        auStack_160._8_8_ = (piVar23->ob_base).ob_refcnt;
        phStack_150 = (handle *)plVar16[3];
      }
      else {
        auStack_160._8_8_ = (piVar23->ob_base).ob_refcnt;
        local_168 = (undefined1  [8])*plVar16;
      }
      auStack_160._0_8_ = plVar16[1];
      *plVar16 = (long)piVar23;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
      if (local_d0.m_ptr != &local_c0) {
        operator_delete(local_d0.m_ptr,
                        (ulong)((long)&((PyObject *)local_c0.ob_refcnt)->ob_refcnt + 1));
      }
      if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
      }
      if ((function_call *)local_f8._0_8_ != (function_call *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,
                        (ulong)((long)(function_record **)local_f8._16_8_ + 1));
      }
      uVar24 = 0;
      do {
        __val = uVar24 + 1;
        __len = 1;
        if (8 < uVar24) {
          uVar21 = (ulong)__val;
          uVar24 = 4;
          do {
            __len = uVar24;
            uVar10 = (uint)uVar21;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0010edc2;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0010edc2;
            }
            if (uVar10 < 10000) goto LAB_0010edc2;
            uVar21 = uVar21 / 10000;
            uVar24 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0010edc2:
        local_f8._0_8_ = local_f8 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,__len,__val);
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x1194e0);
        pfVar29 = (function_call *)(puVar15 + 2);
        if ((function_call *)*puVar15 == pfVar29) {
          local_198._0_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
          local_198._8_8_ = puVar15[3];
          local_1a8._0_8_ = (PyObject *)local_198;
        }
        else {
          local_198._0_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
          local_1a8._0_8_ = (PyObject *)*puVar15;
        }
        local_1a8._8_8_ = puVar15[1];
        *puVar15 = pfVar29;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append(local_1a8);
        local_1d8._0_8_ = local_1d8 + 0x10;
        pfVar29 = (function_call *)(puVar15 + 2);
        if ((function_call *)*puVar15 == pfVar29) {
          local_1d8._16_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
          oStack_1c0.super_handle.m_ptr = (handle)puVar15[3];
        }
        else {
          local_1d8._16_8_ = ((PyObject *)&pfVar29->func)->ob_refcnt;
          local_1d8._0_8_ = (function_call *)*puVar15;
        }
        local_1d8._8_8_ = puVar15[1];
        *puVar15 = pfVar29;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_168,local_1d8._0_8_);
        if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
        }
        if ((function_call *)local_f8._0_8_ != (function_call *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,
                          (ulong)((long)(function_record **)local_f8._16_8_ + 1));
        }
        if ((*local_d8 & 1) == 0) {
LAB_0010f06d:
          std::__cxx11::string::append((char *)local_168);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1d8,(char *)(local_170->field_1).simple_value_holder[0],
                     (allocator<char> *)local_1a8);
          cVar26 = (char)(string *)local_1d8;
          lVar11 = std::__cxx11::string::find(cVar26,0x28);
          pfVar29 = (function_call *)(lVar11 + 7);
          if ((ulong)local_1d8._8_8_ <= pfVar29) {
LAB_0010f044:
            if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
            }
            goto LAB_0010f06d;
          }
          pfVar17 = (function_call *)std::__cxx11::string::find((char *)local_1d8,0x1187ff,0);
          std::__cxx11::string::rfind((char *)local_1d8,0x118c98,0xffffffffffffffff);
          if (pfVar17 < (ulong)local_1d8._8_8_) {
            pfVar18 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 2);
          }
          else {
            pfVar18 = (function_call *)std::__cxx11::string::find(cVar26,0x29);
            pfVar17 = pfVar18;
          }
          if ((pfVar17 <= pfVar29) || ((ulong)local_1d8._8_8_ <= pfVar18)) goto LAB_0010f044;
          std::__cxx11::string::append((string *)local_168,(ulong)local_1d8,(ulong)pfVar29);
          std::__cxx11::string::push_back((char)(string *)local_168);
          std::__cxx11::string::append((string *)local_168,(ulong)local_1d8,(ulong)pfVar18);
          if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
            operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
          }
        }
        std::__cxx11::string::append((char *)local_168);
        local_170 = (instance *)local_170[2].field_1.simple_value_holder[0];
        uVar24 = __val;
      } while (local_170 != (instance *)0x0);
      std::__cxx11::string::append(local_168);
      local_d0.m_ptr = (PyObject *)local_178;
      if (local_178 != (function_call *)0x0) {
        ((PyObject *)&local_178->func)->ob_refcnt = ((PyObject *)&local_178->func)->ob_refcnt + 1;
      }
      bVar32 = false;
      for (pfVar29 = (function_call *)(ulong)(*local_d8 & 1);
          pfVar17 = (function_call *)PyTuple_Size(local_d0.m_ptr), pfVar29 < pfVar17;
          pfVar29 = (function_call *)((long)&((PyObject *)&pfVar29->func)->ob_refcnt + 1)) {
        bVar7 = true;
        if (bVar32) {
          std::__cxx11::string::append(local_168);
          bVar7 = bVar32;
        }
        bVar32 = bVar7;
        local_1a8._8_8_ = local_d0.m_ptr;
        local_198._8_8_ = (PyObject *)0x0;
        local_198._0_8_ = pfVar29;
        poVar19 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1a8)
        ;
        local_100.m_ptr = (poVar19->super_handle).m_ptr;
        if ((function_call *)local_100.m_ptr != (function_call *)0x0) {
          ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt =
               ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt + 1;
        }
        hVar14.m_ptr = (PyObject *)PyObject_Repr(local_100.m_ptr);
        if ((function_call *)hVar14.m_ptr == (function_call *)0x0) {
          local_178 = (function_call *)__cxa_allocate_exception(0x28);
          error_already_set::error_already_set((error_already_set *)local_178);
          __cxa_throw(local_178,&error_already_set::typeinfo,error_already_set::~error_already_set);
        }
        local_f8._0_8_ = hVar14.m_ptr;
        str::operator_cast_to_string((string *)local_1d8,(str *)local_f8);
        std::__cxx11::string::_M_append(local_168,local_1d8._0_8_);
        if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        object::~object((object *)local_f8);
        object::~object((object *)&local_100);
        object::~object((object *)(local_198 + 8));
      }
      if (local_1b0 != (function_call *)0x0) {
        local_100.m_ptr = (PyObject *)local_1b0;
        ((PyObject *)&local_1b0->func)->ob_refcnt = ((PyObject *)&local_1b0->func)->ob_refcnt + 1;
        lVar11 = PyDict_Size();
        if (lVar11 != 0) {
          if (bVar32) {
            std::__cxx11::string::append(local_168);
          }
          std::__cxx11::string::append(local_168);
          local_1d8._0_8_ = local_100.m_ptr;
          local_1d8._8_8_ = (function_call *)0x0;
          local_1d8._16_8_ = (function_call *)0x0;
          oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          iVar9 = PyDict_Next(local_100.m_ptr,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
          if ((iVar9 != 0) && (oStack_1c0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
            local_f8._0_8_ = local_1d8._8_8_;
            local_f8._8_8_ = local_1d8._16_8_;
            while( true ) {
              str::str((str *)&local_48,"{}=");
              str::format<pybind11::handle&>((str *)&local_58,&local_48);
              str::operator_cast_to_string((string *)local_1a8,(str *)&local_58);
              std::__cxx11::string::_M_append(local_168,local_1a8._0_8_);
              if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
              }
              object::~object(&local_58);
              object::~object((object *)&local_48);
              hVar14.m_ptr = (PyObject *)PyObject_Repr(local_f8._8_8_);
              if (hVar14.m_ptr == (PyObject *)0x0) {
                local_1b0 = (function_call *)__cxa_allocate_exception(0x28);
                error_already_set::error_already_set((error_already_set *)local_1b0);
                __cxa_throw(local_1b0,&error_already_set::typeinfo,
                            error_already_set::~error_already_set);
              }
              local_58.super_handle.m_ptr = (handle)(handle)hVar14.m_ptr;
              str::operator_cast_to_string((string *)local_1a8,(str *)&local_58);
              std::__cxx11::string::_M_append(local_168,local_1a8._0_8_);
              if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
              }
              object::~object(&local_58);
              iVar9 = PyDict_Next(local_1d8._0_8_,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
              if ((iVar9 == 0) || (oStack_1c0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
              break;
              local_f8._0_8_ = local_1d8._8_8_;
              local_f8._8_8_ = local_1d8._16_8_;
              std::__cxx11::string::append(local_168);
            }
          }
        }
        object::~object((object *)&local_100);
      }
      lVar11 = std::__cxx11::string::find(local_168,0x118ee9,0);
      if (lVar11 != -1) {
        std::__cxx11::string::append(local_168);
      }
      PyErr_SetString(_PyExc_TypeError,local_168);
      object::~object((object *)&local_d0);
      if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_0010f5c3;
    }
LAB_0010e92f:
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_f8);
  }
  if (hVar14.m_ptr != (PyObject *)0x0) {
    if ((*local_d8 & 1) == 0) {
      return hVar14.m_ptr;
    }
    if (((local_88.inst)->field_0x30 & 2) == 0) {
      bVar8 = *(byte *)((long)(PyObject **)local_88.index +
                       *(long *)&(((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)((long)local_88.inst + 0x18))->
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 )._M_impl.super__Vector_impl_data);
    }
    else {
      bVar8 = (byte)(local_88.inst)->field_0x30 >> 2;
    }
    if ((bVar8 & 1) == 0) {
      (*(local_88.type)->init_instance)((instance *)local_90,(void *)0x0);
      return hVar14.m_ptr;
    }
    return hVar14.m_ptr;
  }
  local_168 = (undefined1  [8])(auStack_160 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,
             "Unable to convert function return value to a Python type! The signature was\n\t","");
  std::__cxx11::string::append(local_168);
  lVar11 = std::__cxx11::string::find(local_168,0x118ee9,0);
  if (lVar11 != -1) {
    std::__cxx11::string::append(local_168);
  }
  PyErr_SetString(_PyExc_TypeError,local_168);
  if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010f5c3:
  operator_delete((void *)local_168,(ulong)((long)(PyTypeObject **)auStack_160._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!parent || !PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid or missing `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg_rec.name);
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }